

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

void __thiscall
OpenMD::OpenMDBitSet::setBits(OpenMDBitSet *this,size_t fromIndex,size_t toIndex,bool value)

{
  long lVar1;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool value_local;
  
  lVar1 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __first.super__Bit_iterator_base._M_p =
       lVar1 + ((long)fromIndex / 0x40) * 8 +
       (ulong)((fromIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  __first.super__Bit_iterator_base._M_offset = (uint)fromIndex & 0x3f;
  __last.super__Bit_iterator_base._M_p =
       lVar1 + ((long)toIndex / 0x40) * 8 +
       (ulong)((toIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_offset = (uint)toIndex & 0x3f;
  __last.super__Bit_iterator_base._12_4_ = 0;
  value_local = value;
  std::__fill_a1(__first,__last,&value_local);
  return;
}

Assistant:

void OpenMDBitSet::setBits(size_t fromIndex, size_t toIndex, bool value) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;
    std::fill(first, last, value);
  }